

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O0

Qiniu_Error Qiniu_File_Open(Qiniu_File **pp,char *file)

{
  int iVar1;
  uint *puVar2;
  Qiniu_Error QVar3;
  int fd;
  char *file_local;
  Qiniu_File **pp_local;
  Qiniu_Error err;
  
  iVar1 = open(file,0,0x1a4);
  if (iVar1 == -1) {
    puVar2 = (uint *)__errno_location();
    pp_local = (Qiniu_File **)(ulong)*puVar2;
    err._0_8_ = anon_var_dwarf_473c;
  }
  else {
    pp_local = (Qiniu_File **)Qiniu_OK._0_8_;
    err._0_8_ = Qiniu_OK.message;
    *pp = (Qiniu_File *)(long)iVar1;
  }
  QVar3._0_8_ = (ulong)pp_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_File_Open(Qiniu_File **pp, const char *file)
{
	Qiniu_Error err;
	Qiniu_Posix_Handle fd = Qiniu_Posix_Open(file, O_BINARY | O_RDONLY, 0644);
	if (fd != Qiniu_Posix_InvalidHandle)
	{
		err = Qiniu_OK;
		*pp = (Qiniu_File *)(size_t)fd;
	}
	else
	{
		err.code = errno;
		err.message = "open file failed";
	}
	return err;
}